

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

void duckdb::ApproxQuantileScalarOperation::Finalize<duckdb::dtime_tz_t,duckdb::ApproxQuantileState>
               (ApproxQuantileState *state,dtime_tz_t *target,AggregateFinalizeData *finalize_data)

{
  undefined8 *in_RDI;
  Value source;
  ApproximateQuantileBindData *bind_data;
  dtime_tz_t *in_stack_000000d8;
  double *in_stack_000000e0;
  Value in_stack_ffffffffffffffc8;
  FunctionData *in_stack_ffffffffffffffd0;
  TDigest *this;
  
  if (in_RDI[1] == 0) {
    AggregateFinalizeData::ReturnNull((AggregateFinalizeData *)source);
  }
  else {
    duckdb_tdigest::TDigest::compress((TDigest *)0x1cdc0d8);
    optional_ptr<duckdb::FunctionData,_true>::operator->
              ((optional_ptr<duckdb::FunctionData,_true> *)in_stack_ffffffffffffffd0);
    FunctionData::Cast<duckdb::ApproximateQuantileBindData>(in_stack_ffffffffffffffd0);
    this = (TDigest *)*in_RDI;
    vector<float,_true>::operator[]
              ((vector<float,_true> *)this,(size_type)in_stack_ffffffffffffffc8);
    duckdb_tdigest::TDigest::quantile(this,in_stack_ffffffffffffffc8);
    ApproxQuantileCoding::Decode<double,duckdb::dtime_tz_t>(in_stack_000000e0,in_stack_000000d8);
  }
  return;
}

Assistant:

static void Finalize(STATE &state, TARGET_TYPE &target, AggregateFinalizeData &finalize_data) {
		if (state.pos == 0) {
			finalize_data.ReturnNull();
			return;
		}
		D_ASSERT(state.h);
		D_ASSERT(finalize_data.input.bind_data);
		state.h->compress();
		auto &bind_data = finalize_data.input.bind_data->template Cast<ApproximateQuantileBindData>();
		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto source = state.h->quantile(bind_data.quantiles[0]);
		ApproxQuantileCoding::Decode(source, target);
	}